

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

void helper_aesimc_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  long lVar1;
  uint uVar2;
  ZMMReg tmp;
  
  tmp._q_ZMMReg[2] = s->_q_ZMMReg[2];
  tmp._q_ZMMReg[0] = s->_q_ZMMReg[0];
  tmp._q_ZMMReg[1] = s->_q_ZMMReg[1];
  lVar1 = 0;
  do {
    uVar2 = AES_imc[tmp._b_ZMMReg[lVar1 * 4 + 1]][1] ^ AES_imc[tmp._b_ZMMReg[lVar1 * 4]][0] ^
            AES_imc[tmp._b_ZMMReg[lVar1 * 4 + 2]][2] ^ AES_imc[tmp._b_ZMMReg[lVar1 * 4 + 3]][3];
    d->_l_ZMMReg[lVar1] =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return;
}

Assistant:

void glue(helper_aesimc, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int i;
    Reg tmp = *s;

    for (i = 0 ; i < 4 ; i++) {
        d->L(i) = bswap32(AES_imc[tmp.B(4*i+0)][0] ^
                          AES_imc[tmp.B(4*i+1)][1] ^
                          AES_imc[tmp.B(4*i+2)][2] ^
                          AES_imc[tmp.B(4*i+3)][3]);
    }
}